

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O1

void __thiscall Variable_parentOfVariable_Test::TestBody(Variable_parentOfVariable_Test *this)

{
  char cVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  VariablePtr v;
  ComponentPtr c;
  shared_ptr<libcellml::ParentedEntity> local_58;
  AssertHelper local_48 [8];
  internal local_40 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38 [2];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  shared_ptr<libcellml::Component> local_20;
  
  libcellml::Component::create();
  libcellml::Variable::create();
  libcellml::Component::addVariable
            ((shared_ptr *)
             local_20.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::ParentedEntity::parent();
  testing::internal::
  CmpHelperEQ<std::shared_ptr<libcellml::Component>,std::shared_ptr<libcellml::ParentedEntity>>
            (local_40,"c","v->parent()",&local_20,&local_58);
  if (local_58.super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_38[0].ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_38[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x1e9,pcVar2);
    testing::internal::AssertHelper::operator=(local_48,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(local_48);
    if (local_58.super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') &&
         (local_58.super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          != (element_type *)0x0)) {
        (**(code **)(*(long *)local_58.
                              super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr + 8))();
      }
      local_58.super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  if (local_20.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

TEST(Variable, parentOfVariable)
{
    libcellml::ComponentPtr c = libcellml::Component::create();
    libcellml::VariablePtr v = libcellml::Variable::create();
    c->addVariable(v);
    EXPECT_EQ(c, v->parent());
}